

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void parseThreeCommaList<double>(string *lst,double *a,double *b,double *c)

{
  byte bVar1;
  size_type sVar2;
  runtime_error *this;
  reference pvVar3;
  string local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  istringstream local_378 [8];
  istringstream ssp;
  undefined1 local_1e8 [8];
  vector<double,_std::allocator<double>_> vec;
  double v;
  string part;
  istringstream ss;
  double *c_local;
  double *b_local;
  double *a_local;
  string *lst_local;
  
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(part.field_2._M_local_buf + 8),(string *)lst,_S_in);
  std::__cxx11::string::string((string *)&v);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_1e8);
  while( true ) {
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) break;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(part.field_2._M_local_buf + 8),(string *)&v,',');
    std::__cxx11::istringstream::istringstream(local_378,(string *)&v,_S_in);
    std::istream::operator>>
              ((istream *)local_378,
               (double *)
               &vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,std::allocator<double>>::emplace_back<double&>
              ((vector<double,std::allocator<double>> *)local_1e8,
               (double *)
               &vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::istringstream::~istringstream(local_378);
  }
  sVar2 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)local_1e8);
  if (sVar2 != 3) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    sVar2 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_1e8);
    std::__cxx11::to_string(&local_3d8,sVar2);
    std::operator+(&local_3b8,"Error: Input vector was ",&local_3d8);
    std::operator+(&local_398,&local_3b8,", expected 3.");
    std::runtime_error::runtime_error(this,(string *)&local_398);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_1e8,0);
  *a = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_1e8,1);
  *b = *pvVar3;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_1e8,2);
  *c = *pvVar3;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_1e8);
  std::__cxx11::string::~string((string *)&v);
  std::__cxx11::istringstream::~istringstream((istringstream *)(part.field_2._M_local_buf + 8));
  return;
}

Assistant:

void parseThreeCommaList(std::string lst, T& a, T& b, T& c)
{
    std::istringstream ss(lst);
    std::string part;
    T v;
    std::vector<T> vec;
    while(ss.good()) {
        getline( ss, part, ',' );
//        vec.emplace_back(std::stoi(part));
        std::istringstream ssp(part);
        ssp >> v;
        vec.emplace_back(v);
    }

    if (vec.size() != 3)
        throw std::runtime_error("Error: Input vector was " + std::to_string(vec.size()) + ", expected 3.");

    a = vec[0];
    b = vec[1];
    c = vec[2];
}